

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindHitGroupForInstance
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,ITopLevelAS *pTLAS,
          char *pInstanceName,Uint32 RayOffsetInHitGroupIndex,char *pShaderGroupName,void *pData,
          Uint32 DataSize)

{
  uint uVar1;
  Char *pCVar2;
  TopLevelASVkImpl *pTLAS_00;
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar3;
  unsigned_long *puVar4;
  PipelineStateVkImpl *this_01;
  uchar *puVar5;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *Args_1;
  char (*Args_1_00) [96];
  TLASInstanceDesc TVar6;
  undefined1 local_1e8 [8];
  string msg_8;
  size_t Offset;
  uint local_1b8;
  Uint32 Index;
  Uint32 i;
  size_type local_1a8;
  char (*local_1a0) [96];
  size_t Stride;
  long lStack_190;
  Uint32 GroupSize;
  size_t EndIndex;
  undefined1 local_180 [4];
  Uint32 BeginIndex;
  string msg_7;
  Uint32 GeometryCount;
  Uint32 InstanceOffset;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  TLASInstanceDesc Desc;
  uint local_c0;
  TLASBuildInfo Info;
  TopLevelASImplType *pTLASImpl;
  string msg_2;
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  void *pData_local;
  char *pShaderGroupName_local;
  Uint32 RayOffsetInHitGroupIndex_local;
  char *pInstanceName_local;
  ITopLevelAS *pTLAS_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)(ulong)(DataSize == 0);
  msg.field_2._8_8_ = pData;
  if ((pData == (void *)0x0) != (DataSize == 0)) {
    FormatString<char[26],char[38]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0xf6;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)local_58);
  }
  if ((msg.field_2._8_8_ != 0) && (Args_1 = this, DataSize != this->m_ShaderRecordSize)) {
    FormatString<char[26],char[61]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",
               (char (*) [61])this);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0xf7;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf7);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[26],char[17]>
              ((string *)&pTLASImpl,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pTLAS != nullptr",(char (*) [17])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0xf8;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf8);
    std::__cxx11::string::~string((string *)&pTLASImpl);
  }
  pTLAS_00 = ClassPtrCast<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>(pTLAS);
  TopLevelASBase<Diligent::EngineVkImplTraits>::GetBuildInfo
            ((TLASBuildInfo *)((long)&Desc.pBLAS + 4),
             &pTLAS_00->super_TopLevelASBase<Diligent::EngineVkImplTraits>);
  TVar6 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                    (&pTLAS_00->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pInstanceName);
  if (((char)Info.InstanceCount != '\0') && ((char)Info.InstanceCount != '\x01')) {
    FormatString<char[26],char[115]>
              ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY || Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE"
               ,(char (*) [115])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0xff;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xff);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  if (local_c0 <= RayOffsetInHitGroupIndex) {
    FormatString<char[26],char[47]>
              ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RayOffsetInHitGroupIndex < Info.HitGroupStride",(char (*) [47])Args_1
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0x100;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x100);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  msg_3.field_2._8_4_ = TVar6.ContributionToHitGroupIndex;
  if (msg_3.field_2._8_4_ == -1) {
    FormatString<char[26],char[50]>
              ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.ContributionToHitGroupIndex != INVALID_INDEX",
               (char (*) [50])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *)0x101;
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x101);
    std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
  }
  Desc._0_8_ = TVar6.pBLAS;
  if (Desc._0_8_ == 0) {
    FormatString<char[26],char[22]>
              ((string *)&GeometryCount,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.pBLAS != nullptr",(char (*) [22])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x102);
    std::__cxx11::string::~string((string *)&GeometryCount);
  }
  msg_7.field_2._12_4_ = msg_3.field_2._8_4_;
  msg_7.field_2._8_4_ = 0;
  if ((char)Info.InstanceCount == '\0') {
    msg_7.field_2._8_4_ = (**(code **)(*(long *)Desc._0_8_ + 0x50))();
  }
  else if ((char)Info.InstanceCount == '\x01') {
    msg_7.field_2._8_4_ = 1;
  }
  else {
    FormatString<char[21]>((string *)local_180,(char (*) [21])"unknown binding mode");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x10c);
    std::__cxx11::string::~string((string *)local_180);
  }
  EndIndex._4_4_ = msg_7.field_2._12_4_;
  lStack_190 = (ulong)(uint)msg_7.field_2._12_4_ +
               (ulong)(uint)msg_7.field_2._8_4_ * (ulong)local_c0;
  this_00 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                       );
  pGVar3 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  Stride._4_4_ = (pGVar3->RayTracing).ShaderGroupHandleSize;
  local_1a0 = (char (*) [96])(ulong)this->m_ShaderRecordStride;
  local_1a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_HitGroupsRecord);
  _i = lStack_190 * (long)local_1a0;
  puVar4 = std::max<unsigned_long>(&local_1a8,(unsigned_long *)&i);
  Index._3_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_HitGroupsRecord,*puVar4,(value_type_conflict4 *)((long)&Index + 3));
  this->m_Changed = true;
  for (local_1b8 = 0; local_1b8 < (uint)msg_7.field_2._8_4_; local_1b8 = local_1b8 + 1) {
    uVar1 = EndIndex._4_4_ + local_1b8 * local_c0 + RayOffsetInHitGroupIndex;
    msg_8.field_2._8_8_ = (ulong)uVar1 * (long)local_1a0;
    this_01 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPSO);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&this->m_HitGroupsRecord);
    Args_1_00 = local_1a0;
    PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
              (&this_01->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pShaderGroupName,
               puVar5 + msg_8.field_2._8_8_,(size_t)local_1a0);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&this->m_HitGroupsRecord);
    memcpy(puVar5 + (ulong)Stride._4_4_ + msg_8.field_2._8_8_,(void *)msg.field_2._8_8_,
           (ulong)DataSize);
    if ((uVar1 < Info.HitGroupStride) || ((uint)Info._8_4_ < uVar1)) {
      FormatString<char[26],char[96]>
                ((string *)local_1e8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex"
                 ,Args_1_00);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"BindHitGroupForInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x121);
      std::__cxx11::string::~string((string *)local_1e8);
    }
    OnBindHitGroup(this,pTLAS_00,(ulong)uVar1);
  }
  return;
}

Assistant:

BindHitGroupForInstance(ITopLevelAS* pTLAS,
                                                    const char*  pInstanceName,
                                                    Uint32       RayOffsetInHitGroupIndex,
                                                    const char*  pShaderGroupName,
                                                    const void*  pData,
                                                    Uint32       DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));
        VERIFY_EXPR(pTLAS != nullptr);

        TopLevelASImplType* const pTLASImpl = ClassPtrCast<TopLevelASImplType>(pTLAS);
        const TLASBuildInfo       Info      = pTLASImpl->GetBuildInfo();
        const TLASInstanceDesc    Desc      = pTLASImpl->GetInstanceDesc(pInstanceName);

        VERIFY_EXPR(Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY ||
                    Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE);
        VERIFY_EXPR(RayOffsetInHitGroupIndex < Info.HitGroupStride);
        VERIFY_EXPR(Desc.ContributionToHitGroupIndex != INVALID_INDEX);
        VERIFY_EXPR(Desc.pBLAS != nullptr);

        const Uint32 InstanceOffset = Desc.ContributionToHitGroupIndex;
        Uint32       GeometryCount  = 0;

        switch (Info.BindingMode)
        {
            // clang-format off
            case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     GeometryCount = Desc.pBLAS->GetActualGeometryCount(); break;
            case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     GeometryCount = 1;                                    break;
            default:                                      UNEXPECTED("unknown binding mode");
                // clang-format on
        }

        const Uint32 BeginIndex = InstanceOffset;
        const size_t EndIndex   = InstanceOffset + size_t{GeometryCount} * size_t{Info.HitGroupStride};
        const Uint32 GroupSize  = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Stride     = this->m_ShaderRecordStride;

        this->m_HitGroupsRecord.resize(std::max(this->m_HitGroupsRecord.size(), EndIndex * Stride), Uint8{EmptyElem});
        this->m_Changed = true;

        for (Uint32 i = 0; i < GeometryCount; ++i)
        {
            Uint32 Index  = BeginIndex + i * Info.HitGroupStride + RayOffsetInHitGroupIndex;
            size_t Offset = Index * Stride;
            this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_HitGroupsRecord.data() + Offset, Stride);

            std::memcpy(this->m_HitGroupsRecord.data() + Offset + GroupSize, pData, DataSize);

#ifdef DILIGENT_DEVELOPMENT
            VERIFY_EXPR(Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex);
            OnBindHitGroup(pTLASImpl, Index);
#endif
        }
    }